

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O0

void Abc_SclInstallGenlib(void *pScl,float SlewInit,float Gain,int nGatesMin)

{
  undefined8 uVar1;
  float local_48;
  uint local_44;
  int local_40;
  int nGateCount;
  int RetValue;
  float Slew;
  Vec_Str_t *vStr2;
  Vec_Str_t *vStr;
  SC_Lib *p;
  float local_18;
  int nGatesMin_local;
  float Gain_local;
  float SlewInit_local;
  void *pScl_local;
  
  local_48 = SlewInit;
  vStr = (Vec_Str_t *)pScl;
  p._4_4_ = nGatesMin;
  local_18 = Gain;
  nGatesMin_local = (int)SlewInit;
  _Gain_local = pScl;
  if ((SlewInit == 0.0) && (!NAN(SlewInit))) {
    local_48 = Abc_SclComputeAverageSlew((SC_Lib *)pScl);
  }
  nGateCount = (int)local_48;
  local_44 = SC_LibCellNum((SC_Lib *)vStr);
  if ((local_18 != 0.0) || (NAN(local_18))) {
    vStr2 = Abc_SclProduceGenlibStr
                      ((SC_Lib *)vStr,(float)nGateCount,local_18,p._4_4_,(int *)&local_44);
  }
  else {
    vStr2 = Abc_SclProduceGenlibStrSimple((SC_Lib *)vStr);
  }
  _RetValue = Vec_StrDup(vStr2);
  local_40 = Mio_UpdateGenlib2(vStr2,_RetValue,*(char **)vStr,0);
  Vec_StrFree(vStr2);
  Vec_StrFree(_RetValue);
  if (local_40 == 0) {
    printf("Reading library has filed.\n");
  }
  else if ((local_18 != 0.0) || (NAN(local_18))) {
    uVar1._0_4_ = vStr->nCap;
    uVar1._4_4_ = vStr->nSize;
    printf("Derived GENLIB library \"%s\" with %d gates using slew %.2f ps and gain %.2f.\n",
           (double)(float)nGateCount,(double)local_18,uVar1,(ulong)local_44);
  }
  return;
}

Assistant:

void Abc_SclInstallGenlib( void * pScl, float SlewInit, float Gain, int nGatesMin )
{
    SC_Lib * p = (SC_Lib *)pScl;
    Vec_Str_t * vStr, * vStr2;
    float Slew = (SlewInit == 0) ? Abc_SclComputeAverageSlew(p) : SlewInit;
    int RetValue, nGateCount = SC_LibCellNum(p);
    if ( Gain == 0 )
        vStr = Abc_SclProduceGenlibStrSimple(p);
    else
        vStr = Abc_SclProduceGenlibStr( p, Slew, Gain, nGatesMin, &nGateCount );
    vStr2 = Vec_StrDup( vStr );
    RetValue = Mio_UpdateGenlib2( vStr, vStr2, p->pName, 0 );
    Vec_StrFree( vStr );
    Vec_StrFree( vStr2 );
    if ( !RetValue )
        printf( "Reading library has filed.\n" );
    else if ( Gain != 0 )
        printf( "Derived GENLIB library \"%s\" with %d gates using slew %.2f ps and gain %.2f.\n", p->pName, nGateCount, Slew, Gain );
//    else
//        printf( "Derived unit-delay GENLIB library \"%s\" with %d gates.\n", p->pName, nGateCount );
}